

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

void vkt::rasterization::anon_unknown_0::createRasterizationTests(TestCaseGroup *rasterizationTests)

{
  TestCaseGroup *pTVar1;
  TestNode *pTVar2;
  TestNode *pTVar3;
  WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LinesTestInstance> *pWVar4;
  WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LineStripTestInstance> *pWVar5;
  WidenessTestCase<vkt::rasterization::(anonymous_namespace)::PointTestInstance> *pWVar6;
  FillRuleTestCase *pFVar7;
  CullingTestCase *this;
  TriangleInterpolationTestCase *pTVar8;
  LineInterpolationTestCase *pLVar9;
  ostream *poVar10;
  char *pcVar11;
  allocator<char> local_1201;
  string local_1200;
  allocator<char> local_11d9;
  string local_11d8;
  undefined1 local_11b2;
  allocator<char> local_11b1;
  string local_11b0;
  allocator<char> local_1189;
  string local_1188;
  undefined1 local_1162;
  allocator<char> local_1161;
  string local_1160;
  allocator<char> local_1139;
  string local_1138;
  undefined1 local_1111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f0;
  TestNode *local_10d0;
  TestCaseGroup *interpolation_1;
  string local_10c0;
  allocator<char> local_1099;
  string local_1098;
  undefined1 local_1072;
  allocator<char> local_1071;
  string local_1070;
  allocator<char> local_1049;
  string local_1048;
  undefined1 local_1022;
  allocator<char> local_1021;
  string local_1020;
  allocator<char> local_ff9;
  string local_ff8;
  undefined1 local_fd2;
  allocator<char> local_fd1;
  string local_fd0;
  allocator<char> local_fa9;
  string local_fa8;
  undefined1 local_f82;
  allocator<char> local_f81;
  string local_f80;
  allocator<char> local_f59;
  string local_f58;
  undefined1 local_f31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f10;
  TestNode *local_ef0;
  TestCaseGroup *fillRules_1;
  string local_ee0;
  allocator<char> local_eb9;
  string local_eb8;
  undefined1 local_e92;
  allocator<char> local_e91;
  string local_e90;
  allocator<char> local_e69;
  string local_e68;
  undefined1 local_e42;
  allocator<char> local_e41;
  string local_e40;
  allocator<char> local_e19;
  string local_e18;
  undefined1 local_df2;
  allocator<char> local_df1;
  string local_df0;
  allocator<char> local_dc9;
  string local_dc8;
  undefined1 local_da1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d80;
  TestNode *local_d60;
  TestCaseGroup *primitives_1;
  ostringstream caseName;
  int local_bdc;
  VkSampleCountFlagBits VStack_bd8;
  int samplesNdx;
  VkSampleCountFlagBits samples [6];
  string local_bb8;
  allocator<char> local_b91;
  string local_b90;
  undefined1 local_b6a;
  allocator<char> local_b69;
  string local_b68;
  allocator<char> local_b41;
  string local_b40;
  undefined1 local_b1a;
  allocator<char> local_b19;
  string local_b18;
  allocator<char> local_af1;
  string local_af0;
  undefined1 local_aca;
  allocator<char> local_ac9;
  string local_ac8;
  allocator<char> local_aa1;
  string local_aa0;
  undefined1 local_a7a;
  allocator<char> local_a79;
  string local_a78;
  allocator<char> local_a51;
  string local_a50;
  undefined1 local_a2a;
  allocator<char> local_a29;
  string local_a28;
  allocator<char> local_a01;
  string local_a00;
  undefined1 local_9da;
  allocator<char> local_9d9;
  string local_9d8;
  allocator<char> local_9b1;
  string local_9b0;
  TestNode *local_990;
  TestCaseGroup *flatshading;
  string local_980;
  allocator<char> local_959;
  string local_958;
  undefined1 local_932;
  allocator<char> local_931;
  string local_930;
  allocator<char> local_909;
  string local_908;
  undefined1 local_8e2;
  allocator<char> local_8e1;
  string local_8e0;
  allocator<char> local_8b9;
  string local_8b8;
  undefined1 local_892;
  allocator<char> local_891;
  string local_890;
  allocator<char> local_869;
  string local_868;
  undefined1 local_842;
  allocator<char> local_841;
  string local_840;
  allocator<char> local_819;
  string local_818;
  undefined1 local_7f2;
  allocator<char> local_7f1;
  string local_7f0;
  allocator<char> local_7c9;
  string local_7c8;
  undefined1 local_7a2;
  allocator<char> local_7a1;
  string local_7a0;
  allocator<char> local_779;
  string local_778;
  TestNode *local_758;
  TestCaseGroup *projected;
  string local_748;
  allocator<char> local_721;
  string local_720;
  undefined1 local_6fa;
  allocator<char> local_6f9;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  undefined1 local_6aa;
  allocator<char> local_6a9;
  string local_6a8;
  allocator<char> local_681;
  string local_680;
  undefined1 local_65a;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630;
  undefined1 local_60a;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  undefined1 local_5ba;
  allocator<char> local_5b9;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  undefined1 local_56a;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  TestNode *local_520;
  TestCaseGroup *basic;
  TestCaseGroup *interpolation;
  string local_508;
  allocator<char> local_4e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  undefined1 local_480 [8];
  string name;
  int polygonModeNdx;
  int frontOrderNdx;
  int primitiveNdx;
  int cullModeNdx;
  TestCaseGroup *culling;
  string local_440;
  allocator<char> local_419;
  string local_418;
  undefined1 local_3f2;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  undefined1 local_3a2;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  undefined1 local_352;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  undefined1 local_302;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  TestNode *local_2b8;
  TestCaseGroup *fillRules;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  undefined1 local_25a;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  undefined1 local_20a;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  undefined1 local_1ba;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  undefined1 local_16a;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  undefined1 local_11a;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_ca;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_7a;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_51;
  string local_50;
  TestNode *local_20;
  TestCaseGroup *primitives;
  TestContext *testCtx;
  TestCaseGroup *rasterizationTests_local;
  
  testCtx = (TestContext *)rasterizationTests;
  primitives = (TestCaseGroup *)tcu::TestNode::getTestContext(&rasterizationTests->super_TestNode);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,(TestContext *)primitives,"primitives",
             "Primitive rasterization");
  local_20 = pTVar2;
  tcu::TestNode::addChild((TestNode *)testCtx,pTVar2);
  pTVar2 = local_20;
  pTVar3 = (TestNode *)operator_new(0x78);
  pTVar1 = primitives;
  local_7a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"triangles",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, verify rasterization result"
             ,&local_79);
  BaseTestCase<vkt::rasterization::(anonymous_namespace)::TrianglesTestInstance>::BaseTestCase
            ((BaseTestCase<vkt::rasterization::(anonymous_namespace)::TrianglesTestInstance> *)
             pTVar3,(TestContext *)pTVar1,&local_50,&local_78,VK_SAMPLE_COUNT_1_BIT);
  local_7a = 0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pTVar2 = local_20;
  pTVar3 = (TestNode *)operator_new(0x78);
  pTVar1 = primitives;
  local_ca = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"triangle_strip",&local_a1)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP, verify rasterization result"
             ,&local_c9);
  BaseTestCase<vkt::rasterization::(anonymous_namespace)::TriangleStripTestInstance>::BaseTestCase
            ((BaseTestCase<vkt::rasterization::(anonymous_namespace)::TriangleStripTestInstance> *)
             pTVar3,(TestContext *)pTVar1,&local_a0,&local_c8,VK_SAMPLE_COUNT_1_BIT);
  local_ca = 0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pTVar2 = local_20;
  pTVar3 = (TestNode *)operator_new(0x78);
  pTVar1 = primitives;
  local_11a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"triangle_fan",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN, verify rasterization result",
             &local_119);
  BaseTestCase<vkt::rasterization::(anonymous_namespace)::TriangleFanTestInstance>::BaseTestCase
            ((BaseTestCase<vkt::rasterization::(anonymous_namespace)::TriangleFanTestInstance> *)
             pTVar3,(TestContext *)pTVar1,&local_f0,&local_118,VK_SAMPLE_COUNT_1_BIT);
  local_11a = 0;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  pTVar2 = local_20;
  pWVar4 = (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LinesTestInstance> *)
           operator_new(0x80);
  pTVar1 = primitives;
  local_16a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"lines",&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST, verify rasterization result",
             &local_169);
  WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LinesTestInstance>::WidenessTestCase
            (pWVar4,(TestContext *)pTVar1,&local_140,&local_168,PRIMITIVEWIDENESS_NARROW,
             VK_SAMPLE_COUNT_1_BIT);
  local_16a = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pWVar4);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  pTVar2 = local_20;
  pWVar5 = (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LineStripTestInstance> *)
           operator_new(0x80);
  pTVar1 = primitives;
  local_1ba = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"line_strip",&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_STRIP, verify rasterization result",
             &local_1b9);
  WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LineStripTestInstance>::
  WidenessTestCase(pWVar5,(TestContext *)pTVar1,&local_190,&local_1b8,PRIMITIVEWIDENESS_NARROW,
                   VK_SAMPLE_COUNT_1_BIT);
  local_1ba = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pWVar5);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  pTVar2 = local_20;
  pWVar4 = (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LinesTestInstance> *)
           operator_new(0x80);
  pTVar1 = primitives;
  local_20a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"lines_wide",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST with wide lines, verify rasterization result"
             ,&local_209);
  WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LinesTestInstance>::WidenessTestCase
            (pWVar4,(TestContext *)pTVar1,&local_1e0,&local_208,PRIMITIVEWIDENESS_WIDE,
             VK_SAMPLE_COUNT_1_BIT);
  local_20a = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pWVar4);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  pTVar2 = local_20;
  pWVar5 = (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LineStripTestInstance> *)
           operator_new(0x80);
  pTVar1 = primitives;
  local_25a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"line_strip_wide",&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_STRIP with wide lines, verify rasterization result"
             ,&local_259);
  WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LineStripTestInstance>::
  WidenessTestCase(pWVar5,(TestContext *)pTVar1,&local_230,&local_258,PRIMITIVEWIDENESS_WIDE,
                   VK_SAMPLE_COUNT_1_BIT);
  local_25a = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pWVar5);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  pTVar2 = local_20;
  pWVar6 = (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::PointTestInstance> *)
           operator_new(0x80);
  pTVar1 = primitives;
  fillRules._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"points",&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_POINT_LIST, verify rasterization result",
             (allocator<char> *)((long)&fillRules + 7));
  WidenessTestCase<vkt::rasterization::(anonymous_namespace)::PointTestInstance>::WidenessTestCase
            (pWVar6,(TestContext *)pTVar1,&local_280,&local_2a8,PRIMITIVEWIDENESS_WIDE,
             VK_SAMPLE_COUNT_1_BIT);
  fillRules._6_1_ = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pWVar6);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&fillRules + 7));
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,(TestContext *)primitives,"fill_rules","Primitive fill rules");
  local_2b8 = pTVar2;
  tcu::TestNode::addChild((TestNode *)testCtx,pTVar2);
  pTVar2 = local_2b8;
  pFVar7 = (FillRuleTestCase *)operator_new(0x80);
  pTVar1 = primitives;
  local_302 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"basic_quad",&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"Verify fill rules",&local_301);
  FillRuleTestCase::FillRuleTestCase
            (pFVar7,(TestContext *)pTVar1,&local_2d8,&local_300,FILLRULECASE_BASIC,
             VK_SAMPLE_COUNT_1_BIT);
  local_302 = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar7);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  pTVar2 = local_2b8;
  pFVar7 = (FillRuleTestCase *)operator_new(0x80);
  pTVar1 = primitives;
  local_352 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"basic_quad_reverse",&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"Verify fill rules",&local_351);
  FillRuleTestCase::FillRuleTestCase
            (pFVar7,(TestContext *)pTVar1,&local_328,&local_350,FILLRULECASE_REVERSED,
             VK_SAMPLE_COUNT_1_BIT);
  local_352 = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar7);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  pTVar2 = local_2b8;
  pFVar7 = (FillRuleTestCase *)operator_new(0x80);
  pTVar1 = primitives;
  local_3a2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"clipped_full",&local_379)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"Verify fill rules",&local_3a1);
  FillRuleTestCase::FillRuleTestCase
            (pFVar7,(TestContext *)pTVar1,&local_378,&local_3a0,FILLRULECASE_CLIPPED_FULL,
             VK_SAMPLE_COUNT_1_BIT);
  local_3a2 = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar7);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  pTVar2 = local_2b8;
  pFVar7 = (FillRuleTestCase *)operator_new(0x80);
  pTVar1 = primitives;
  local_3f2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"clipped_partly",&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Verify fill rules",&local_3f1);
  FillRuleTestCase::FillRuleTestCase
            (pFVar7,(TestContext *)pTVar1,&local_3c8,&local_3f0,FILLRULECASE_CLIPPED_PARTIAL,
             VK_SAMPLE_COUNT_1_BIT);
  local_3f2 = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar7);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  pTVar2 = local_2b8;
  pFVar7 = (FillRuleTestCase *)operator_new(0x80);
  pTVar1 = primitives;
  culling._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"projected",&local_419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"Verify fill rules",(allocator<char> *)((long)&culling + 7));
  FillRuleTestCase::FillRuleTestCase
            (pFVar7,(TestContext *)pTVar1,&local_418,&local_440,FILLRULECASE_PROJECTED,
             VK_SAMPLE_COUNT_1_BIT);
  culling._6_1_ = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar7);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator((allocator<char> *)((long)&culling + 7));
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,(TestContext *)primitives,"culling","Culling");
  tcu::TestNode::addChild((TestNode *)testCtx,pTVar2);
  for (frontOrderNdx = 0; frontOrderNdx < 3; frontOrderNdx = frontOrderNdx + 1) {
    for (polygonModeNdx = 0; polygonModeNdx < 3; polygonModeNdx = polygonModeNdx + 1) {
      for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 2;
          name.field_2._12_4_ = name.field_2._12_4_ + 1) {
        for (name.field_2._8_4_ = 0; (int)name.field_2._8_4_ < 3;
            name.field_2._8_4_ = name.field_2._8_4_ + 1) {
          if ((createRasterizationTests::cullModes[frontOrderNdx].mode != 3) ||
             (createRasterizationTests::polygonModes[(int)name.field_2._8_4_].mode ==
              VK_POLYGON_MODE_FILL)) {
            pcVar11 = createRasterizationTests::cullModes[frontOrderNdx].prefix;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4e0,pcVar11,&local_4e1);
            std::operator+(&local_4c0,&local_4e0,
                           createRasterizationTests::primitiveTypes[polygonModeNdx].name);
            std::operator+(&local_4a0,&local_4c0,
                           createRasterizationTests::frontOrders[(int)name.field_2._12_4_].postfix);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_480,&local_4a0,
                           createRasterizationTests::polygonModes[(int)name.field_2._8_4_].name);
            std::__cxx11::string::~string((string *)&local_4a0);
            std::__cxx11::string::~string((string *)&local_4c0);
            std::__cxx11::string::~string((string *)&local_4e0);
            std::allocator<char>::~allocator(&local_4e1);
            this = (CullingTestCase *)operator_new(0x88);
            pTVar1 = primitives;
            interpolation._6_1_ = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_508,"Test primitive culling.",
                       (allocator<char> *)((long)&interpolation + 7));
            CullingTestCase::CullingTestCase
                      (this,(TestContext *)pTVar1,(string *)local_480,&local_508,
                       createRasterizationTests::cullModes[frontOrderNdx].mode,
                       createRasterizationTests::primitiveTypes[polygonModeNdx].type,
                       createRasterizationTests::frontOrders[(int)name.field_2._12_4_].mode,
                       createRasterizationTests::polygonModes[(int)name.field_2._8_4_].mode,
                       VK_SAMPLE_COUNT_1_BIT);
            interpolation._6_1_ = 0;
            tcu::TestNode::addChild(pTVar2,(TestNode *)this);
            std::__cxx11::string::~string((string *)&local_508);
            std::allocator<char>::~allocator((allocator<char> *)((long)&interpolation + 7));
            std::__cxx11::string::~string((string *)local_480);
          }
        }
      }
    }
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,(TestContext *)primitives,"interpolation","Test interpolation")
  ;
  basic = (TestCaseGroup *)pTVar2;
  tcu::TestNode::addChild((TestNode *)testCtx,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,(TestContext *)primitives,"basic",
             "Non-projective interpolation");
  local_520 = pTVar2;
  tcu::TestNode::addChild(&basic->super_TestNode,pTVar2);
  pTVar2 = local_520;
  pTVar8 = (TriangleInterpolationTestCase *)operator_new(0x80);
  pTVar1 = primitives;
  local_56a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"triangles",&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"Verify triangle interpolation",&local_569);
  TriangleInterpolationTestCase::TriangleInterpolationTestCase
            (pTVar8,(TestContext *)pTVar1,&local_540,&local_568,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,
             0,VK_SAMPLE_COUNT_1_BIT);
  local_56a = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar8);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  pTVar2 = local_520;
  pTVar8 = (TriangleInterpolationTestCase *)operator_new(0x80);
  pTVar1 = primitives;
  local_5ba = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_590,"triangle_strip",&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"Verify triangle strip interpolation",&local_5b9);
  TriangleInterpolationTestCase::TriangleInterpolationTestCase
            (pTVar8,(TestContext *)pTVar1,&local_590,&local_5b8,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP
             ,0,VK_SAMPLE_COUNT_1_BIT);
  local_5ba = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar8);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  pTVar2 = local_520;
  pTVar8 = (TriangleInterpolationTestCase *)operator_new(0x80);
  pTVar1 = primitives;
  local_60a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,"triangle_fan",&local_5e1)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"Verify triangle fan interpolation",&local_609);
  TriangleInterpolationTestCase::TriangleInterpolationTestCase
            (pTVar8,(TestContext *)pTVar1,&local_5e0,&local_608,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,0
             ,VK_SAMPLE_COUNT_1_BIT);
  local_60a = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar8);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  pTVar2 = local_520;
  pLVar9 = (LineInterpolationTestCase *)operator_new(0x88);
  pTVar1 = primitives;
  local_65a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,"lines",&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_658,"Verify line interpolation",&local_659);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar9,(TestContext *)pTVar1,&local_630,&local_658,VK_PRIMITIVE_TOPOLOGY_LINE_LIST,0,
             PRIMITIVEWIDENESS_NARROW,VK_SAMPLE_COUNT_1_BIT);
  local_65a = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar9);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  pTVar2 = local_520;
  pLVar9 = (LineInterpolationTestCase *)operator_new(0x88);
  pTVar1 = primitives;
  local_6aa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"line_strip",&local_681);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"Verify line strip interpolation",&local_6a9);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar9,(TestContext *)pTVar1,&local_680,&local_6a8,VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,0,
             PRIMITIVEWIDENESS_NARROW,VK_SAMPLE_COUNT_1_BIT);
  local_6aa = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar9);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator(&local_681);
  pTVar2 = local_520;
  pLVar9 = (LineInterpolationTestCase *)operator_new(0x88);
  pTVar1 = primitives;
  local_6fa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d0,"lines_wide",&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f8,"Verify wide line interpolation",&local_6f9);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar9,(TestContext *)pTVar1,&local_6d0,&local_6f8,VK_PRIMITIVE_TOPOLOGY_LINE_LIST,0,
             PRIMITIVEWIDENESS_WIDE,VK_SAMPLE_COUNT_1_BIT);
  local_6fa = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar9);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  pTVar2 = local_520;
  pLVar9 = (LineInterpolationTestCase *)operator_new(0x88);
  pTVar1 = primitives;
  projected._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"line_strip_wide",&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,"Verify wide line strip interpolation",
             (allocator<char> *)((long)&projected + 7));
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar9,(TestContext *)pTVar1,&local_720,&local_748,VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,0,
             PRIMITIVEWIDENESS_WIDE,VK_SAMPLE_COUNT_1_BIT);
  projected._6_1_ = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar9);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator((allocator<char> *)((long)&projected + 7));
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,(TestContext *)primitives,"projected",
             "Projective interpolation");
  local_758 = pTVar2;
  tcu::TestNode::addChild(&basic->super_TestNode,pTVar2);
  pTVar2 = local_758;
  pTVar8 = (TriangleInterpolationTestCase *)operator_new(0x80);
  pTVar1 = primitives;
  local_7a2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"triangles",&local_779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7a0,"Verify triangle interpolation",&local_7a1);
  TriangleInterpolationTestCase::TriangleInterpolationTestCase
            (pTVar8,(TestContext *)pTVar1,&local_778,&local_7a0,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,
             2,VK_SAMPLE_COUNT_1_BIT);
  local_7a2 = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar8);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::allocator<char>::~allocator(&local_7a1);
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator(&local_779);
  pTVar2 = local_758;
  pTVar8 = (TriangleInterpolationTestCase *)operator_new(0x80);
  pTVar1 = primitives;
  local_7f2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c8,"triangle_strip",&local_7c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f0,"Verify triangle strip interpolation",&local_7f1);
  TriangleInterpolationTestCase::TriangleInterpolationTestCase
            (pTVar8,(TestContext *)pTVar1,&local_7c8,&local_7f0,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP
             ,2,VK_SAMPLE_COUNT_1_BIT);
  local_7f2 = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar8);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::allocator<char>::~allocator(&local_7f1);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::allocator<char>::~allocator(&local_7c9);
  pTVar2 = local_758;
  pTVar8 = (TriangleInterpolationTestCase *)operator_new(0x80);
  pTVar1 = primitives;
  local_842 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_818,"triangle_fan",&local_819)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_840,"Verify triangle fan interpolation",&local_841);
  TriangleInterpolationTestCase::TriangleInterpolationTestCase
            (pTVar8,(TestContext *)pTVar1,&local_818,&local_840,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,2
             ,VK_SAMPLE_COUNT_1_BIT);
  local_842 = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar8);
  std::__cxx11::string::~string((string *)&local_840);
  std::allocator<char>::~allocator(&local_841);
  std::__cxx11::string::~string((string *)&local_818);
  std::allocator<char>::~allocator(&local_819);
  pTVar2 = local_758;
  pLVar9 = (LineInterpolationTestCase *)operator_new(0x88);
  pTVar1 = primitives;
  local_892 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"lines",&local_869);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_890,"Verify line interpolation",&local_891);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar9,(TestContext *)pTVar1,&local_868,&local_890,VK_PRIMITIVE_TOPOLOGY_LINE_LIST,2,
             PRIMITIVEWIDENESS_NARROW,VK_SAMPLE_COUNT_1_BIT);
  local_892 = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar9);
  std::__cxx11::string::~string((string *)&local_890);
  std::allocator<char>::~allocator(&local_891);
  std::__cxx11::string::~string((string *)&local_868);
  std::allocator<char>::~allocator(&local_869);
  pTVar2 = local_758;
  pLVar9 = (LineInterpolationTestCase *)operator_new(0x88);
  pTVar1 = primitives;
  local_8e2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b8,"line_strip",&local_8b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8e0,"Verify line strip interpolation",&local_8e1);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar9,(TestContext *)pTVar1,&local_8b8,&local_8e0,VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,2,
             PRIMITIVEWIDENESS_NARROW,VK_SAMPLE_COUNT_1_BIT);
  local_8e2 = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar9);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::allocator<char>::~allocator(&local_8e1);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::allocator<char>::~allocator(&local_8b9);
  pTVar2 = local_758;
  pLVar9 = (LineInterpolationTestCase *)operator_new(0x88);
  pTVar1 = primitives;
  local_932 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_908,"lines_wide",&local_909);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_930,"Verify wide line interpolation",&local_931);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar9,(TestContext *)pTVar1,&local_908,&local_930,VK_PRIMITIVE_TOPOLOGY_LINE_LIST,2,
             PRIMITIVEWIDENESS_WIDE,VK_SAMPLE_COUNT_1_BIT);
  local_932 = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar9);
  std::__cxx11::string::~string((string *)&local_930);
  std::allocator<char>::~allocator(&local_931);
  std::__cxx11::string::~string((string *)&local_908);
  std::allocator<char>::~allocator(&local_909);
  pTVar2 = local_758;
  pLVar9 = (LineInterpolationTestCase *)operator_new(0x88);
  pTVar1 = primitives;
  flatshading._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_958,"line_strip_wide",&local_959);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_980,"Verify wide line strip interpolation",
             (allocator<char> *)((long)&flatshading + 7));
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar9,(TestContext *)pTVar1,&local_958,&local_980,VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,2,
             PRIMITIVEWIDENESS_WIDE,VK_SAMPLE_COUNT_1_BIT);
  flatshading._6_1_ = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar9);
  std::__cxx11::string::~string((string *)&local_980);
  std::allocator<char>::~allocator((allocator<char> *)((long)&flatshading + 7));
  std::__cxx11::string::~string((string *)&local_958);
  std::allocator<char>::~allocator(&local_959);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,(TestContext *)primitives,"flatshading","Test flatshading");
  local_990 = pTVar2;
  tcu::TestNode::addChild((TestNode *)testCtx,pTVar2);
  pTVar2 = local_990;
  pTVar8 = (TriangleInterpolationTestCase *)operator_new(0x80);
  pTVar1 = primitives;
  local_9da = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b0,"triangles",&local_9b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9d8,"Verify triangle flatshading",&local_9d9);
  TriangleInterpolationTestCase::TriangleInterpolationTestCase
            (pTVar8,(TestContext *)pTVar1,&local_9b0,&local_9d8,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,
             4,VK_SAMPLE_COUNT_1_BIT);
  local_9da = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar8);
  std::__cxx11::string::~string((string *)&local_9d8);
  std::allocator<char>::~allocator(&local_9d9);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::allocator<char>::~allocator(&local_9b1);
  pTVar2 = local_990;
  pTVar8 = (TriangleInterpolationTestCase *)operator_new(0x80);
  pTVar1 = primitives;
  local_a2a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a00,"triangle_strip",&local_a01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a28,"Verify triangle strip flatshading",&local_a29);
  TriangleInterpolationTestCase::TriangleInterpolationTestCase
            (pTVar8,(TestContext *)pTVar1,&local_a00,&local_a28,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP
             ,4,VK_SAMPLE_COUNT_1_BIT);
  local_a2a = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar8);
  std::__cxx11::string::~string((string *)&local_a28);
  std::allocator<char>::~allocator(&local_a29);
  std::__cxx11::string::~string((string *)&local_a00);
  std::allocator<char>::~allocator(&local_a01);
  pTVar2 = local_990;
  pTVar8 = (TriangleInterpolationTestCase *)operator_new(0x80);
  pTVar1 = primitives;
  local_a7a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a50,"triangle_fan",&local_a51)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a78,"Verify triangle fan flatshading",&local_a79);
  TriangleInterpolationTestCase::TriangleInterpolationTestCase
            (pTVar8,(TestContext *)pTVar1,&local_a50,&local_a78,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,4
             ,VK_SAMPLE_COUNT_1_BIT);
  local_a7a = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar8);
  std::__cxx11::string::~string((string *)&local_a78);
  std::allocator<char>::~allocator(&local_a79);
  std::__cxx11::string::~string((string *)&local_a50);
  std::allocator<char>::~allocator(&local_a51);
  pTVar2 = local_990;
  pLVar9 = (LineInterpolationTestCase *)operator_new(0x88);
  pTVar1 = primitives;
  local_aca = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_aa0,"lines",&local_aa1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ac8,"Verify line flatshading",&local_ac9);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar9,(TestContext *)pTVar1,&local_aa0,&local_ac8,VK_PRIMITIVE_TOPOLOGY_LINE_LIST,4,
             PRIMITIVEWIDENESS_NARROW,VK_SAMPLE_COUNT_1_BIT);
  local_aca = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar9);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::allocator<char>::~allocator(&local_ac9);
  std::__cxx11::string::~string((string *)&local_aa0);
  std::allocator<char>::~allocator(&local_aa1);
  pTVar2 = local_990;
  pLVar9 = (LineInterpolationTestCase *)operator_new(0x88);
  pTVar1 = primitives;
  local_b1a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_af0,"line_strip",&local_af1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b18,"Verify line strip flatshading",&local_b19);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar9,(TestContext *)pTVar1,&local_af0,&local_b18,VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,4,
             PRIMITIVEWIDENESS_NARROW,VK_SAMPLE_COUNT_1_BIT);
  local_b1a = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar9);
  std::__cxx11::string::~string((string *)&local_b18);
  std::allocator<char>::~allocator(&local_b19);
  std::__cxx11::string::~string((string *)&local_af0);
  std::allocator<char>::~allocator(&local_af1);
  pTVar2 = local_990;
  pLVar9 = (LineInterpolationTestCase *)operator_new(0x88);
  pTVar1 = primitives;
  local_b6a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b40,"lines_wide",&local_b41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b68,"Verify wide line flatshading",&local_b69);
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar9,(TestContext *)pTVar1,&local_b40,&local_b68,VK_PRIMITIVE_TOPOLOGY_LINE_LIST,4,
             PRIMITIVEWIDENESS_WIDE,VK_SAMPLE_COUNT_1_BIT);
  local_b6a = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar9);
  std::__cxx11::string::~string((string *)&local_b68);
  std::allocator<char>::~allocator(&local_b69);
  std::__cxx11::string::~string((string *)&local_b40);
  std::allocator<char>::~allocator(&local_b41);
  pTVar2 = local_990;
  pLVar9 = (LineInterpolationTestCase *)operator_new(0x88);
  pTVar1 = primitives;
  samples[5]._2_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b90,"line_strip_wide",&local_b91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bb8,"Verify wide line strip flatshading",
             (allocator<char> *)((long)samples + 0x17));
  LineInterpolationTestCase::LineInterpolationTestCase
            (pLVar9,(TestContext *)pTVar1,&local_b90,&local_bb8,VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,4,
             PRIMITIVEWIDENESS_WIDE,VK_SAMPLE_COUNT_1_BIT);
  samples[5]._2_1_ = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar9);
  std::__cxx11::string::~string((string *)&local_bb8);
  std::allocator<char>::~allocator((allocator<char> *)((long)samples + 0x17));
  std::__cxx11::string::~string((string *)&local_b90);
  std::allocator<char>::~allocator(&local_b91);
  _VStack_bd8 = 0x400000002;
  samples[0] = VK_SAMPLE_COUNT_8_BIT;
  samples[1] = VK_SAMPLE_COUNT_16_BIT;
  samples[2] = VK_SAMPLE_COUNT_32_BIT;
  samples[3] = VK_SAMPLE_COUNT_64_BIT;
  for (local_bdc = 0; local_bdc < 6; local_bdc = local_bdc + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&primitives_1);
    poVar10 = std::operator<<((ostream *)&primitives_1,"_multisample_");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,2 << ((byte)local_bdc & 0x1f));
    std::operator<<(poVar10,"_bit");
    pTVar2 = (TestNode *)operator_new(0x70);
    pTVar1 = primitives;
    local_da1 = 1;
    std::__cxx11::ostringstream::str();
    std::operator+(&local_d80,"primitives",&local_da0);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,(TestContext *)pTVar1,pcVar11,"Primitive rasterization");
    local_da1 = 0;
    std::__cxx11::string::~string((string *)&local_d80);
    std::__cxx11::string::~string((string *)&local_da0);
    local_d60 = pTVar2;
    tcu::TestNode::addChild((TestNode *)testCtx,pTVar2);
    pTVar2 = local_d60;
    pTVar3 = (TestNode *)operator_new(0x78);
    pTVar1 = primitives;
    local_df2 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_dc8,"triangles",&local_dc9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_df0,
               "Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, verify rasterization result"
               ,&local_df1);
    BaseTestCase<vkt::rasterization::(anonymous_namespace)::TrianglesTestInstance>::BaseTestCase
              ((BaseTestCase<vkt::rasterization::(anonymous_namespace)::TrianglesTestInstance> *)
               pTVar3,(TestContext *)pTVar1,&local_dc8,&local_df0,(&VStack_bd8)[local_bdc]);
    local_df2 = 0;
    tcu::TestNode::addChild(pTVar2,pTVar3);
    std::__cxx11::string::~string((string *)&local_df0);
    std::allocator<char>::~allocator(&local_df1);
    std::__cxx11::string::~string((string *)&local_dc8);
    std::allocator<char>::~allocator(&local_dc9);
    pTVar2 = local_d60;
    pWVar4 = (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LinesTestInstance> *)
             operator_new(0x80);
    pTVar1 = primitives;
    local_e42 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e18,"lines",&local_e19);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e40,
               "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST, verify rasterization result",
               &local_e41);
    WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LinesTestInstance>::WidenessTestCase
              (pWVar4,(TestContext *)pTVar1,&local_e18,&local_e40,PRIMITIVEWIDENESS_NARROW,
               (&VStack_bd8)[local_bdc]);
    local_e42 = 0;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pWVar4);
    std::__cxx11::string::~string((string *)&local_e40);
    std::allocator<char>::~allocator(&local_e41);
    std::__cxx11::string::~string((string *)&local_e18);
    std::allocator<char>::~allocator(&local_e19);
    pTVar2 = local_d60;
    pWVar4 = (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LinesTestInstance> *)
             operator_new(0x80);
    pTVar1 = primitives;
    local_e92 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e68,"lines_wide",&local_e69)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e90,
               "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST with wide lines, verify rasterization result"
               ,&local_e91);
    WidenessTestCase<vkt::rasterization::(anonymous_namespace)::LinesTestInstance>::WidenessTestCase
              (pWVar4,(TestContext *)pTVar1,&local_e68,&local_e90,PRIMITIVEWIDENESS_WIDE,
               (&VStack_bd8)[local_bdc]);
    local_e92 = 0;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pWVar4);
    std::__cxx11::string::~string((string *)&local_e90);
    std::allocator<char>::~allocator(&local_e91);
    std::__cxx11::string::~string((string *)&local_e68);
    std::allocator<char>::~allocator(&local_e69);
    pTVar2 = local_d60;
    pWVar6 = (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::PointTestInstance> *)
             operator_new(0x80);
    pTVar1 = primitives;
    fillRules_1._6_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_eb8,"points",&local_eb9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ee0,
               "Render primitives as VK_PRIMITIVE_TOPOLOGY_POINT_LIST, verify rasterization result",
               (allocator<char> *)((long)&fillRules_1 + 7));
    WidenessTestCase<vkt::rasterization::(anonymous_namespace)::PointTestInstance>::WidenessTestCase
              (pWVar6,(TestContext *)pTVar1,&local_eb8,&local_ee0,PRIMITIVEWIDENESS_WIDE,
               (&VStack_bd8)[local_bdc]);
    fillRules_1._6_1_ = 0;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pWVar6);
    std::__cxx11::string::~string((string *)&local_ee0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&fillRules_1 + 7));
    std::__cxx11::string::~string((string *)&local_eb8);
    std::allocator<char>::~allocator(&local_eb9);
    pTVar2 = (TestNode *)operator_new(0x70);
    pTVar1 = primitives;
    local_f31 = 1;
    std::__cxx11::ostringstream::str();
    std::operator+(&local_f10,"fill_rules",&local_f30);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,(TestContext *)pTVar1,pcVar11,"Primitive fill rules");
    local_f31 = 0;
    std::__cxx11::string::~string((string *)&local_f10);
    std::__cxx11::string::~string((string *)&local_f30);
    local_ef0 = pTVar2;
    tcu::TestNode::addChild((TestNode *)testCtx,pTVar2);
    pTVar2 = local_ef0;
    pFVar7 = (FillRuleTestCase *)operator_new(0x80);
    pTVar1 = primitives;
    local_f82 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f58,"basic_quad",&local_f59)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f80,"Verify fill rules",&local_f81);
    FillRuleTestCase::FillRuleTestCase
              (pFVar7,(TestContext *)pTVar1,&local_f58,&local_f80,FILLRULECASE_BASIC,
               (&VStack_bd8)[local_bdc]);
    local_f82 = 0;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar7);
    std::__cxx11::string::~string((string *)&local_f80);
    std::allocator<char>::~allocator(&local_f81);
    std::__cxx11::string::~string((string *)&local_f58);
    std::allocator<char>::~allocator(&local_f59);
    pTVar2 = local_ef0;
    pFVar7 = (FillRuleTestCase *)operator_new(0x80);
    pTVar1 = primitives;
    local_fd2 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_fa8,"basic_quad_reverse",&local_fa9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_fd0,"Verify fill rules",&local_fd1);
    FillRuleTestCase::FillRuleTestCase
              (pFVar7,(TestContext *)pTVar1,&local_fa8,&local_fd0,FILLRULECASE_REVERSED,
               (&VStack_bd8)[local_bdc]);
    local_fd2 = 0;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar7);
    std::__cxx11::string::~string((string *)&local_fd0);
    std::allocator<char>::~allocator(&local_fd1);
    std::__cxx11::string::~string((string *)&local_fa8);
    std::allocator<char>::~allocator(&local_fa9);
    pTVar2 = local_ef0;
    pFVar7 = (FillRuleTestCase *)operator_new(0x80);
    pTVar1 = primitives;
    local_1022 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ff8,"clipped_full",&local_ff9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1020,"Verify fill rules",&local_1021);
    FillRuleTestCase::FillRuleTestCase
              (pFVar7,(TestContext *)pTVar1,&local_ff8,&local_1020,FILLRULECASE_CLIPPED_FULL,
               (&VStack_bd8)[local_bdc]);
    local_1022 = 0;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar7);
    std::__cxx11::string::~string((string *)&local_1020);
    std::allocator<char>::~allocator(&local_1021);
    std::__cxx11::string::~string((string *)&local_ff8);
    std::allocator<char>::~allocator(&local_ff9);
    pTVar2 = local_ef0;
    pFVar7 = (FillRuleTestCase *)operator_new(0x80);
    pTVar1 = primitives;
    local_1072 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1048,"clipped_partly",&local_1049);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1070,"Verify fill rules",&local_1071);
    FillRuleTestCase::FillRuleTestCase
              (pFVar7,(TestContext *)pTVar1,&local_1048,&local_1070,FILLRULECASE_CLIPPED_PARTIAL,
               (&VStack_bd8)[local_bdc]);
    local_1072 = 0;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar7);
    std::__cxx11::string::~string((string *)&local_1070);
    std::allocator<char>::~allocator(&local_1071);
    std::__cxx11::string::~string((string *)&local_1048);
    std::allocator<char>::~allocator(&local_1049);
    pTVar2 = local_ef0;
    pFVar7 = (FillRuleTestCase *)operator_new(0x80);
    pTVar1 = primitives;
    interpolation_1._6_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1098,"projected",&local_1099);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10c0,"Verify fill rules",
               (allocator<char> *)((long)&interpolation_1 + 7));
    FillRuleTestCase::FillRuleTestCase
              (pFVar7,(TestContext *)pTVar1,&local_1098,&local_10c0,FILLRULECASE_PROJECTED,
               (&VStack_bd8)[local_bdc]);
    interpolation_1._6_1_ = 0;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar7);
    std::__cxx11::string::~string((string *)&local_10c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&interpolation_1 + 7));
    std::__cxx11::string::~string((string *)&local_1098);
    std::allocator<char>::~allocator(&local_1099);
    pTVar2 = (TestNode *)operator_new(0x70);
    pTVar1 = primitives;
    local_1111 = 1;
    std::__cxx11::ostringstream::str();
    std::operator+(&local_10f0,"interpolation",&local_1110);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,(TestContext *)pTVar1,pcVar11,"Test interpolation");
    local_1111 = 0;
    std::__cxx11::string::~string((string *)&local_10f0);
    std::__cxx11::string::~string((string *)&local_1110);
    local_10d0 = pTVar2;
    tcu::TestNode::addChild((TestNode *)testCtx,pTVar2);
    pTVar2 = local_10d0;
    pTVar8 = (TriangleInterpolationTestCase *)operator_new(0x80);
    pTVar1 = primitives;
    local_1162 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1138,"triangles",&local_1139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1160,"Verify triangle interpolation",&local_1161);
    TriangleInterpolationTestCase::TriangleInterpolationTestCase
              (pTVar8,(TestContext *)pTVar1,&local_1138,&local_1160,
               VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,0,(&VStack_bd8)[local_bdc]);
    local_1162 = 0;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&local_1160);
    std::allocator<char>::~allocator(&local_1161);
    std::__cxx11::string::~string((string *)&local_1138);
    std::allocator<char>::~allocator(&local_1139);
    pTVar2 = local_10d0;
    pLVar9 = (LineInterpolationTestCase *)operator_new(0x88);
    pTVar1 = primitives;
    local_11b2 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1188,"lines",&local_1189);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11b0,"Verify line interpolation",&local_11b1);
    LineInterpolationTestCase::LineInterpolationTestCase
              (pLVar9,(TestContext *)pTVar1,&local_1188,&local_11b0,VK_PRIMITIVE_TOPOLOGY_LINE_LIST,
               0,PRIMITIVEWIDENESS_NARROW,(&VStack_bd8)[local_bdc]);
    local_11b2 = 0;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar9);
    std::__cxx11::string::~string((string *)&local_11b0);
    std::allocator<char>::~allocator(&local_11b1);
    std::__cxx11::string::~string((string *)&local_1188);
    std::allocator<char>::~allocator(&local_1189);
    pTVar2 = local_10d0;
    pLVar9 = (LineInterpolationTestCase *)operator_new(0x88);
    pTVar1 = primitives;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11d8,"lines_wide",&local_11d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1200,"Verify wide line interpolation",&local_1201);
    LineInterpolationTestCase::LineInterpolationTestCase
              (pLVar9,(TestContext *)pTVar1,&local_11d8,&local_1200,VK_PRIMITIVE_TOPOLOGY_LINE_LIST,
               0,PRIMITIVEWIDENESS_WIDE,(&VStack_bd8)[local_bdc]);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar9);
    std::__cxx11::string::~string((string *)&local_1200);
    std::allocator<char>::~allocator(&local_1201);
    std::__cxx11::string::~string((string *)&local_11d8);
    std::allocator<char>::~allocator(&local_11d9);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&primitives_1);
  }
  return;
}

Assistant:

void createRasterizationTests (tcu::TestCaseGroup* rasterizationTests)
{
	tcu::TestContext&	testCtx		=	rasterizationTests->getTestContext();

	// .primitives
	{
		tcu::TestCaseGroup* const primitives = new tcu::TestCaseGroup(testCtx, "primitives", "Primitive rasterization");

		rasterizationTests->addChild(primitives);

		primitives->addChild(new BaseTestCase<TrianglesTestInstance>		(testCtx, "triangles",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, verify rasterization result"));
		primitives->addChild(new BaseTestCase<TriangleStripTestInstance>	(testCtx, "triangle_strip",		"Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP, verify rasterization result"));
		primitives->addChild(new BaseTestCase<TriangleFanTestInstance>		(testCtx, "triangle_fan",		"Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN, verify rasterization result"));
		primitives->addChild(new WidenessTestCase<LinesTestInstance>		(testCtx, "lines",				"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new WidenessTestCase<LineStripTestInstance>	(testCtx, "line_strip",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_STRIP, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new WidenessTestCase<LinesTestInstance>		(testCtx, "lines_wide",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new WidenessTestCase<LineStripTestInstance>	(testCtx, "line_strip_wide",	"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_STRIP with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new WidenessTestCase<PointTestInstance>		(testCtx, "points",				"Render primitives as VK_PRIMITIVE_TOPOLOGY_POINT_LIST, verify rasterization result",						PRIMITIVEWIDENESS_WIDE));
	}

	// .fill_rules
	{
		tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(testCtx, "fill_rules", "Primitive fill rules");

		rasterizationTests->addChild(fillRules);

		fillRules->addChild(new FillRuleTestCase(testCtx,	"basic_quad",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_BASIC));
		fillRules->addChild(new FillRuleTestCase(testCtx,	"basic_quad_reverse",	"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_REVERSED));
		fillRules->addChild(new FillRuleTestCase(testCtx,	"clipped_full",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_CLIPPED_FULL));
		fillRules->addChild(new FillRuleTestCase(testCtx,	"clipped_partly",		"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_CLIPPED_PARTIAL));
		fillRules->addChild(new FillRuleTestCase(testCtx,	"projected",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_PROJECTED));
	}

	// .culling
	{
		static const struct CullMode
		{
			VkCullModeFlags	mode;
			const char*		prefix;
		} cullModes[] =
		{
			{ VK_CULL_MODE_FRONT_BIT,				"front_"	},
			{ VK_CULL_MODE_BACK_BIT,				"back_"		},
			{ VK_CULL_MODE_FRONT_AND_BACK,			"both_"		},
		};
		static const struct PrimitiveType
		{
			VkPrimitiveTopology	type;
			const char*			name;
		} primitiveTypes[] =
		{
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,			"triangles"			},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,			"triangle_strip"	},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,			"triangle_fan"		},
		};
		static const struct FrontFaceOrder
		{
			VkFrontFace	mode;
			const char*	postfix;
		} frontOrders[] =
		{
			{ VK_FRONT_FACE_COUNTER_CLOCKWISE,	""			},
			{ VK_FRONT_FACE_CLOCKWISE,			"_reverse"	},
		};

		static const struct PolygonMode
		{
			VkPolygonMode	mode;
			const char*		name;
		} polygonModes[] =
		{
			{ VK_POLYGON_MODE_FILL,		""		},
			{ VK_POLYGON_MODE_LINE,		"_line"		},
			{ VK_POLYGON_MODE_POINT,	"_point"	}
		};

		tcu::TestCaseGroup* const culling = new tcu::TestCaseGroup(testCtx, "culling", "Culling");

		rasterizationTests->addChild(culling);

		for (int cullModeNdx	= 0; cullModeNdx	< DE_LENGTH_OF_ARRAY(cullModes);		++cullModeNdx)
		for (int primitiveNdx	= 0; primitiveNdx	< DE_LENGTH_OF_ARRAY(primitiveTypes);	++primitiveNdx)
		for (int frontOrderNdx	= 0; frontOrderNdx	< DE_LENGTH_OF_ARRAY(frontOrders);		++frontOrderNdx)
		for (int polygonModeNdx = 0; polygonModeNdx	< DE_LENGTH_OF_ARRAY(polygonModes);		++polygonModeNdx)
		{
			if (!(cullModes[cullModeNdx].mode == VK_CULL_MODE_FRONT_AND_BACK && polygonModes[polygonModeNdx].mode != VK_POLYGON_MODE_FILL))
			{
				const std::string name = std::string(cullModes[cullModeNdx].prefix) + primitiveTypes[primitiveNdx].name + frontOrders[frontOrderNdx].postfix + polygonModes[polygonModeNdx].name;
				culling->addChild(new CullingTestCase(testCtx, name, "Test primitive culling.", cullModes[cullModeNdx].mode, primitiveTypes[primitiveNdx].type, frontOrders[frontOrderNdx].mode, polygonModes[polygonModeNdx].mode));
			}
		}
	}

	// .interpolation
	{
		tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(testCtx, "interpolation", "Test interpolation");

		rasterizationTests->addChild(interpolation);

		// .basic
		{
			tcu::TestCaseGroup* const basic = new tcu::TestCaseGroup(testCtx, "basic", "Non-projective interpolation");

			interpolation->addChild(basic);

			basic->addChild(new TriangleInterpolationTestCase		(testCtx, "triangles",		"Verify triangle interpolation",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTestCase		(testCtx, "triangle_strip",	"Verify triangle strip interpolation",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTestCase		(testCtx, "triangle_fan",	"Verify triangle fan interpolation",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,		INTERPOLATIONFLAGS_NONE));
			basic->addChild(new LineInterpolationTestCase			(testCtx, "lines",			"Verify line interpolation",			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTestCase			(testCtx, "line_strip",		"Verify line strip interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTestCase			(testCtx, "lines_wide",		"Verify wide line interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
			basic->addChild(new LineInterpolationTestCase			(testCtx, "line_strip_wide","Verify wide line strip interpolation",	VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
		}

		// .projected
		{
			tcu::TestCaseGroup* const projected = new tcu::TestCaseGroup(testCtx, "projected", "Projective interpolation");

			interpolation->addChild(projected);

			projected->addChild(new TriangleInterpolationTestCase	(testCtx, "triangles",		"Verify triangle interpolation",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTestCase	(testCtx, "triangle_strip",	"Verify triangle strip interpolation",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTestCase	(testCtx, "triangle_fan",	"Verify triangle fan interpolation",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,		INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new LineInterpolationTestCase		(testCtx, "lines",			"Verify line interpolation",			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTestCase		(testCtx, "line_strip",		"Verify line strip interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTestCase		(testCtx, "lines_wide",		"Verify wide line interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
			projected->addChild(new LineInterpolationTestCase		(testCtx, "line_strip_wide","Verify wide line strip interpolation",	VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
		}
	}

	// .flatshading
	{
		tcu::TestCaseGroup* const flatshading = new tcu::TestCaseGroup(testCtx, "flatshading", "Test flatshading");

		rasterizationTests->addChild(flatshading);

		flatshading->addChild(new TriangleInterpolationTestCase		(testCtx, "triangles",		"Verify triangle flatshading",			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new TriangleInterpolationTestCase		(testCtx, "triangle_strip",	"Verify triangle strip flatshading",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new TriangleInterpolationTestCase		(testCtx, "triangle_fan",	"Verify triangle fan flatshading",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,		INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new LineInterpolationTestCase			(testCtx, "lines",			"Verify line flatshading",				VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTestCase			(testCtx, "line_strip",		"Verify line strip flatshading",		VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTestCase			(testCtx, "lines_wide",		"Verify wide line flatshading",			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
		flatshading->addChild(new LineInterpolationTestCase			(testCtx, "line_strip_wide","Verify wide line strip flatshading",	VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
	}

	const VkSampleCountFlagBits samples[] =
	{
		VK_SAMPLE_COUNT_2_BIT,
		VK_SAMPLE_COUNT_4_BIT,
		VK_SAMPLE_COUNT_8_BIT,
		VK_SAMPLE_COUNT_16_BIT,
		VK_SAMPLE_COUNT_32_BIT,
		VK_SAMPLE_COUNT_64_BIT
	};

	for (int samplesNdx = 0; samplesNdx < DE_LENGTH_OF_ARRAY(samples); samplesNdx++)
	{
		std::ostringstream caseName;

		caseName << "_multisample_" << (2 << samplesNdx) << "_bit";

		// .primitives
		{
			tcu::TestCaseGroup* const primitives = new tcu::TestCaseGroup(testCtx, ("primitives" + caseName.str()).c_str(), "Primitive rasterization");

			rasterizationTests->addChild(primitives);

			primitives->addChild(new BaseTestCase<TrianglesTestInstance>		(testCtx, "triangles",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, verify rasterization result",					samples[samplesNdx]));
			primitives->addChild(new WidenessTestCase<LinesTestInstance>		(testCtx, "lines",				"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST, verify rasterization result",						PRIMITIVEWIDENESS_NARROW,	samples[samplesNdx]));
			primitives->addChild(new WidenessTestCase<LinesTestInstance>		(testCtx, "lines_wide",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE,		samples[samplesNdx]));
			primitives->addChild(new WidenessTestCase<PointTestInstance>		(testCtx, "points",				"Render primitives as VK_PRIMITIVE_TOPOLOGY_POINT_LIST, verify rasterization result",						PRIMITIVEWIDENESS_WIDE,		samples[samplesNdx]));
		}

		// .fill_rules
		{
			tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(testCtx, ("fill_rules" + caseName.str()).c_str(), "Primitive fill rules");

			rasterizationTests->addChild(fillRules);

			fillRules->addChild(new FillRuleTestCase(testCtx,	"basic_quad",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_BASIC,			samples[samplesNdx]));
			fillRules->addChild(new FillRuleTestCase(testCtx,	"basic_quad_reverse",	"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_REVERSED,		samples[samplesNdx]));
			fillRules->addChild(new FillRuleTestCase(testCtx,	"clipped_full",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_CLIPPED_FULL,	samples[samplesNdx]));
			fillRules->addChild(new FillRuleTestCase(testCtx,	"clipped_partly",		"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_CLIPPED_PARTIAL,	samples[samplesNdx]));
			fillRules->addChild(new FillRuleTestCase(testCtx,	"projected",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_PROJECTED,		samples[samplesNdx]));
		}

		// .interpolation
		{
			tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(testCtx, ("interpolation" + caseName.str()).c_str(), "Test interpolation");

			rasterizationTests->addChild(interpolation);

			interpolation->addChild(new TriangleInterpolationTestCase		(testCtx, "triangles",		"Verify triangle interpolation",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	INTERPOLATIONFLAGS_NONE,								samples[samplesNdx]));
			interpolation->addChild(new LineInterpolationTestCase			(testCtx, "lines",			"Verify line interpolation",			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW,	samples[samplesNdx]));
			interpolation->addChild(new LineInterpolationTestCase			(testCtx, "lines_wide",		"Verify wide line interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE,		samples[samplesNdx]));
		}
	}
}